

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::collapseAll(QTreeView *this)

{
  byte bVar1;
  Entry *pEVar2;
  ulong uVar3;
  char cVar4;
  QHash<QPersistentModelIndex,_QHashDummyValue> QVar5;
  QHash<QPersistentModelIndex,_QHashDummyValue> *other;
  ulong uVar6;
  long in_FS_OFFSET;
  code *local_68;
  quintptr local_60;
  QHash<QPersistentModelIndex,_QHashDummyValue> local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  other = (QHash<QPersistentModelIndex,_QHashDummyValue> *)
          (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                     super_QWidget.field_0x8 + 0x5d8);
  local_50.d = (Data *)0x0;
  QHash<QPersistentModelIndex,_QHashDummyValue>::operator=(&local_50,other);
  QHash<QPersistentModelIndex,_QHashDummyValue>::clear(other);
  if ((*(byte *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget.field_0x8 + 0x30) & 2) != 0) goto LAB_005a706d;
  local_68 = collapsed;
  local_60 = 0;
  local_48 = QMetaMethod::fromSignalImpl(&staticMetaObject,&local_68);
  cVar4 = QObject::isSignalConnected((QMetaMethod *)this);
  if (cVar4 == '\0') goto LAB_005a706d;
  if (local_50.d == (Data *)0x0) {
    uVar6 = 0;
    QVar5.d = (Data *)0x0;
LAB_005a6f9f:
    if (uVar6 == 0 && QVar5.d == (Data *)0x0) goto LAB_005a706d;
  }
  else {
    QVar5.d = local_50.d;
    if ((local_50.d)->spans->offsets[0] == 0xff) {
      uVar3 = 1;
      do {
        uVar6 = uVar3;
        if ((local_50.d)->numBuckets == uVar6) {
          QVar5.d = (Data *)0x0;
          uVar6 = 0;
          break;
        }
        uVar3 = uVar6 + 1;
      } while ((local_50.d)->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
      goto LAB_005a6f9f;
    }
    uVar6 = 0;
  }
  do {
    bVar1 = (QVar5.d)->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f];
    pEVar2 = (QVar5.d)->spans[uVar6 >> 7].entries;
    cVar4 = QPersistentModelIndex::isValid();
    if (cVar4 != '\0') {
      cVar4 = QPersistentModelIndex::flags();
      if (-1 < cVar4) {
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QModelIndex *)&local_68,(QPersistentModelIndex *)(pEVar2 + bVar1));
        local_48._0_8_ = (void *)0x0;
        local_48._8_8_ = &local_68;
        QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)local_48);
      }
    }
    do {
      if ((QVar5.d)->numBuckets - 1 == uVar6) {
        uVar6 = 0;
        QVar5.d = (Data *)0x0;
        break;
      }
      uVar6 = uVar6 + 1;
    } while ((QVar5.d)->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
  } while ((uVar6 != 0) || (QVar5.d != (Data *)0x0));
LAB_005a706d:
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x220))(this);
  QHash<QPersistentModelIndex,_QHashDummyValue>::~QHash(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::collapseAll()
{
    Q_D(QTreeView);
    QSet<QPersistentModelIndex> old_expandedIndexes;
    old_expandedIndexes = d->expandedIndexes;
    d->expandedIndexes.clear();
    if (!signalsBlocked() && isSignalConnected(QMetaMethod::fromSignal(&QTreeView::collapsed))) {
        QSet<QPersistentModelIndex>::const_iterator i = old_expandedIndexes.constBegin();
        for (; i != old_expandedIndexes.constEnd(); ++i) {
            const QPersistentModelIndex &mi = (*i);
            if (mi.isValid() && !(mi.flags() & Qt::ItemNeverHasChildren))
                emit collapsed(mi);
        }
    }
    doItemsLayout();
}